

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

void __thiscall
pbrt::ZSobolSampler::StartPixelSample(ZSobolSampler *this,Point2i *p,int index,int dim)

{
  int iVar1;
  uint64_t uVar2;
  
  this->dimension = dim;
  iVar1 = this->log2SamplesPerPixel;
  uVar2 = EncodeMorton2((p->super_Tuple2<pbrt::Point2,_int>).x,
                        (p->super_Tuple2<pbrt::Point2,_int>).y);
  this->mortonIndex =
       (long)(index << ((byte)iVar1 & 1)) |
       uVar2 << ((ulong)((char)this->log2SamplesPerPixel + 1U & 0xfe) & 0x3f);
  return;
}

Assistant:

PBRT_CPU_GPU
    void StartPixelSample(const Point2i &p, int index, int dim) {
        dimension = dim;
        bool pow2Samples = log2SamplesPerPixel & 1;
        if (pow2Samples)
            index <<= 1;
        mortonIndex =
            (EncodeMorton2(p.x, p.y) << ((log2SamplesPerPixel + 1) & ~1)) | index;
    }